

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::IsWorthSpecializingToInt32Branch(GlobOpt *this,Instr *instr,Value *src1Val,Value *src2Val)

{
  StackSym *pSVar1;
  bool bVar2;
  ValueInfo *pVVar3;
  Opnd *pOVar4;
  RegOpnd *pRVar5;
  GlobOptBlockData *pGVar6;
  StackSym *sym2;
  StackSym *sym1;
  Value *src2Val_local;
  Value *src1Val_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  pVVar3 = ::Value::GetValueInfo(src1Val);
  bVar2 = ValueInfo::HasIntConstantValue(pVVar3,false);
  if (!bVar2) {
    pOVar4 = IR::Instr::GetSrc1(instr);
    bVar2 = IR::Opnd::IsRegOpnd(pOVar4);
    if (bVar2) {
      pOVar4 = IR::Instr::GetSrc1(instr);
      pRVar5 = IR::Opnd::AsRegOpnd(pOVar4);
      pSVar1 = pRVar5->m_sym;
      pGVar6 = CurrentBlockData(this);
      bVar2 = GlobOptBlockData::IsInt32TypeSpecialized(pGVar6,&pSVar1->super_Sym);
      if (!bVar2) {
        pVVar3 = ::Value::GetValueInfo(src2Val);
        bVar2 = ValueInfo::HasIntConstantValue(pVVar3,false);
        if (!bVar2) {
          pOVar4 = IR::Instr::GetSrc2(instr);
          bVar2 = IR::Opnd::IsRegOpnd(pOVar4);
          if (bVar2) {
            pOVar4 = IR::Instr::GetSrc2(instr);
            pRVar5 = IR::Opnd::AsRegOpnd(pOVar4);
            pSVar1 = pRVar5->m_sym;
            pGVar6 = CurrentBlockData(this);
            bVar2 = GlobOptBlockData::IsInt32TypeSpecialized(pGVar6,&pSVar1->super_Sym);
            if (!bVar2) {
              return false;
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool
GlobOpt::IsWorthSpecializingToInt32Branch(IR::Instr const * instr, Value const * src1Val, Value const * src2Val) const
{
    if (!src1Val->GetValueInfo()->HasIntConstantValue() && instr->GetSrc1()->IsRegOpnd())
    {
        StackSym const *sym1 = instr->GetSrc1()->AsRegOpnd()->m_sym;
        if (CurrentBlockData()->IsInt32TypeSpecialized(sym1) == false)
        {
            if (!src2Val->GetValueInfo()->HasIntConstantValue() && instr->GetSrc2()->IsRegOpnd())
            {
                StackSym const *sym2 = instr->GetSrc2()->AsRegOpnd()->m_sym;
                if (CurrentBlockData()->IsInt32TypeSpecialized(sym2) == false)
                {
                    // Type specializing a Br itself isn't worth it, unless one src
                    // is already type specialized
                    return false;
                }
            }
        }
    }
    return true;
}